

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupZeroUndc(Gia_Man_t *p,char *pInit,int nNewPis,int fGiaSimple,int fVerbose)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  void *__s;
  Gia_Man_t *p_00;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  bool bVar7;
  uint local_54;
  int local_50;
  int Count1;
  int iResetFlop;
  int i;
  int *pPiLits;
  Gia_Obj_t *pGStack_38;
  int CountPis;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  int fVerbose_local;
  int fGiaSimple_local;
  int nNewPis_local;
  char *pInit_local;
  Gia_Man_t *p_local;
  
  pPiLits._4_4_ = Gia_ManPiNum(p);
  local_50 = -1;
  local_54 = 0;
  sVar4 = strlen(pInit);
  iVar1 = Gia_ManRegNum(p);
  if ((int)sVar4 != iVar1) {
    __assert_fail("(int)strlen(pInit) == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0xc39,"Gia_Man_t *Gia_ManDupZeroUndc(Gia_Man_t *, char *, int, int, int)");
  }
  iVar1 = Gia_ManRegNum(p);
  __s = malloc((long)iVar1 << 2);
  iVar1 = Gia_ManRegNum(p);
  memset(__s,0xff,(long)iVar1 << 2);
  for (Count1 = 0; iVar1 = Gia_ManRegNum(p), Count1 < iVar1; Count1 = Count1 + 1) {
    if ((pInit[Count1] == 'x') || (pInit[Count1] == 'X')) {
      *(int *)((long)__s + (long)Count1 * 4) = pPiLits._4_4_;
      pPiLits._4_4_ = pPiLits._4_4_ + 1;
    }
  }
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar5 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar5;
  pcVar5 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar5;
  p_00->fGiaSimple = fGiaSimple;
  pGVar6 = Gia_ManConst0(p);
  pGVar6->Value = 0;
  Count1 = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(p);
    bVar7 = false;
    if (Count1 < iVar1) {
      pGStack_38 = Gia_ManCi(p,Count1);
      bVar7 = pGStack_38 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    uVar2 = Gia_ManAppendCi(p_00);
    pGStack_38->Value = uVar2;
    Count1 = Count1 + 1;
  }
  for (Count1 = Gia_ManPiNum(p); Count1 < pPiLits._4_4_; Count1 = Count1 + 1) {
    Gia_ManAppendCi(p_00);
  }
  for (Count1 = 0; Count1 < nNewPis; Count1 = Count1 + 1) {
    Gia_ManAppendCi(p_00);
  }
  Count1 = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar7 = false;
    if (Count1 < iVar1) {
      iVar1 = Gia_ManPiNum(p);
      pGStack_38 = Gia_ManCi(p,iVar1 + Count1);
      bVar7 = pGStack_38 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    uVar2 = Gia_ManAppendCi(p_00);
    pGStack_38->Value = uVar2;
    Count1 = Count1 + 1;
  }
  iVar1 = Gia_ManPiNum(p);
  if (iVar1 < pPiLits._4_4_) {
    local_50 = Gia_ManAppendCi(p_00);
  }
  Gia_ManMarkFanoutDrivers(p);
  Count1 = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar7 = false;
    if (Count1 < iVar1) {
      iVar1 = Gia_ManPiNum(p);
      pGStack_38 = Gia_ManCi(p,iVar1 + Count1);
      bVar7 = pGStack_38 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    if (pInit[Count1] == '1') {
      uVar2 = Abc_LitNot(pGStack_38->Value);
      pGStack_38->Value = uVar2;
      local_54 = local_54 + 1;
    }
    else if ((pInit[Count1] == 'x') || (pInit[Count1] == 'X')) {
      if ((*(ulong *)pGStack_38 >> 0x1e & 1) != 0) {
        uVar2 = pGStack_38->Value;
        pGVar6 = Gia_ManPi(p_00,*(int *)((long)__s + (long)Count1 * 4));
        iVar1 = Gia_Obj2Lit(p_00,pGVar6);
        uVar2 = Gia_ManAppendMux(p_00,local_50,uVar2,iVar1);
        pGStack_38->Value = uVar2;
      }
    }
    else if (pInit[Count1] != '0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                    ,0xc5f,"Gia_Man_t *Gia_ManDupZeroUndc(Gia_Man_t *, char *, int, int, int)");
    }
    Count1 = Count1 + 1;
  }
  Gia_ManCleanMark0(p);
  if (__s != (void *)0x0) {
    free(__s);
  }
  Count1 = 0;
  while( true ) {
    bVar7 = false;
    if (Count1 < p->nObjs) {
      pGStack_38 = Gia_ManObj(p,Count1);
      bVar7 = pGStack_38 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjIsAnd(pGStack_38);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFanin0Copy(pGStack_38);
      iVar3 = Gia_ObjFanin1Copy(pGStack_38);
      uVar2 = Gia_ManAppendAnd(p_00,iVar1,iVar3);
      pGStack_38->Value = uVar2;
    }
    Count1 = Count1 + 1;
  }
  Count1 = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(p);
    bVar7 = false;
    if (Count1 < iVar1) {
      pGStack_38 = Gia_ManCo(p,Count1);
      bVar7 = pGStack_38 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjFanin0Copy(pGStack_38);
    uVar2 = Gia_ManAppendCo(p_00,iVar1);
    pGStack_38->Value = uVar2;
    Count1 = Count1 + 1;
  }
  Count1 = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar7 = false;
    if (Count1 < iVar1) {
      iVar1 = Gia_ManPoNum(p);
      pGStack_38 = Gia_ManCo(p,iVar1 + Count1);
      bVar7 = pGStack_38 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    if (pInit[Count1] == '1') {
      iVar1 = Gia_ObjFanin0Copy(pGStack_38);
      iVar1 = Abc_LitNot(iVar1);
      uVar2 = Gia_ManAppendCo(p_00,iVar1);
      pGStack_38->Value = uVar2;
    }
    else {
      iVar1 = Gia_ObjFanin0Copy(pGStack_38);
      uVar2 = Gia_ManAppendCo(p_00,iVar1);
      pGStack_38->Value = uVar2;
    }
    Count1 = Count1 + 1;
  }
  iVar1 = Gia_ManPiNum(p);
  if (iVar1 < pPiLits._4_4_) {
    Gia_ManAppendCo(p_00,1);
  }
  iVar1 = Gia_ManRegNum(p);
  iVar3 = Gia_ManPiNum(p);
  Gia_ManSetRegNum(p_00,iVar1 + (uint)(iVar3 < pPiLits._4_4_));
  if (fVerbose != 0) {
    iVar1 = Gia_ManPiNum(p);
    printf("Converted %d 1-valued FFs and %d DC-valued FFs.\n",(ulong)local_54,
           (ulong)(uint)(pPiLits._4_4_ - iVar1));
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupZeroUndc( Gia_Man_t * p, char * pInit, int nNewPis, int fGiaSimple, int fVerbose )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int CountPis = Gia_ManPiNum(p), * pPiLits;
    int i, iResetFlop = -1, Count1 = 0;
    //printf( "Using %s\n", pInit );
    // map X-valued flops into new PIs
    assert( (int)strlen(pInit) == Gia_ManRegNum(p) );
    pPiLits = ABC_FALLOC( int, Gia_ManRegNum(p) );
    for ( i = 0; i < Gia_ManRegNum(p); i++ )
        if ( pInit[i] == 'x' || pInit[i] == 'X' )
            pPiLits[i] = CountPis++;
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->fGiaSimple = fGiaSimple;
    Gia_ManConst0(p)->Value = 0;
    // create primary inputs
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    // create additional primary inputs
    for ( i = Gia_ManPiNum(p); i < CountPis; i++ )
        Gia_ManAppendCi( pNew );
    // create additional primary inputs
    for ( i = 0; i < nNewPis; i++ )
        Gia_ManAppendCi( pNew );
    // create flop outputs
    Gia_ManForEachRo( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    // create reset flop output
    if ( CountPis > Gia_ManPiNum(p) )
        iResetFlop = Gia_ManAppendCi( pNew );
    // update flop outputs
    Gia_ManMarkFanoutDrivers( p );
    Gia_ManForEachRo( p, pObj, i )
    {
        if ( pInit[i] == '1' )
            pObj->Value = Abc_LitNot(pObj->Value), Count1++;
        else if ( pInit[i] == 'x' || pInit[i] == 'X' )
        {
            if ( pObj->fMark0 ) // only add MUX if the flop has fanout
                pObj->Value = Gia_ManAppendMux( pNew, iResetFlop, pObj->Value, Gia_Obj2Lit(pNew, Gia_ManPi(pNew, pPiLits[i])) );
        }
        else if ( pInit[i] != '0' )
            assert( 0 );
    }
    Gia_ManCleanMark0( p );
    ABC_FREE( pPiLits );
    // build internal nodes
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // create POs
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    // create flop inputs
    Gia_ManForEachRi( p, pObj, i )
        if ( pInit[i] == '1' )
            pObj->Value = Gia_ManAppendCo( pNew, Abc_LitNot(Gia_ObjFanin0Copy(pObj)) );
        else
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    // create reset flop input
    if ( CountPis > Gia_ManPiNum(p) )
        Gia_ManAppendCo( pNew, 1 );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) + (int)(CountPis > Gia_ManPiNum(p)) );
    if ( fVerbose )
        printf( "Converted %d 1-valued FFs and %d DC-valued FFs.\n", Count1, CountPis-Gia_ManPiNum(p) );
    return pNew;
}